

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3PoslistPhraseMerge(char **pp,int nToken,int isSaveLeft,int isExact,char **pp1,char **pp2)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  byte bVar8;
  byte bVar9;
  char *pEnd;
  byte *pbVar10;
  long lVar11;
  char *pEnd_1;
  byte *pBuf;
  long lVar12;
  long lVar13;
  byte *pbVar14;
  byte *pbVar15;
  byte *pbVar16;
  char *pEnd_2;
  uchar *q;
  int iCol2;
  int iCol1;
  sqlite3_int64 iVal;
  int local_80;
  int local_7c;
  long local_78;
  char **local_70;
  char **local_68;
  int local_5c;
  byte *local_58;
  int local_4c;
  long local_48;
  char **local_40;
  long local_38;
  
  pbVar16 = (byte *)*pp;
  pBuf = (byte *)*pp1;
  pbVar10 = (byte *)*pp2;
  local_7c = 0;
  local_80 = 0;
  local_68 = pp;
  local_5c = isSaveLeft;
  local_4c = isExact;
  local_40 = pp1;
  if (*pBuf == 1) {
    if ((char)pBuf[1] < '\0') {
      uVar3 = sqlite3Fts3GetVarint32((char *)(pBuf + 1),&local_7c);
      uVar5 = (ulong)uVar3;
    }
    else {
      uVar5 = 1;
      local_7c = (int)(char)pBuf[1];
    }
    pBuf = pBuf + 1 + uVar5;
  }
  if (*pbVar10 == 1) {
    if ((char)pbVar10[1] < '\0') {
      uVar3 = sqlite3Fts3GetVarint32((char *)(pbVar10 + 1),&local_80);
      uVar5 = (ulong)uVar3;
    }
    else {
      uVar5 = 1;
      local_80 = (int)(char)pbVar10[1];
    }
    pbVar10 = pbVar10 + 1 + uVar5;
  }
  local_38 = (long)nToken;
  do {
    iVar4 = local_7c;
    while (pbVar15 = pbVar16, iVar4 != local_80) {
      if (iVar4 < local_80) {
        bVar8 = *pBuf;
        if (1 < bVar8) {
          do {
            bVar9 = bVar8 & 0x80;
            bVar8 = pBuf[1];
            pBuf = pBuf + 1;
          } while ((bVar8 & 0xfe) != 0 || bVar9 != 0);
        }
        if (bVar8 == 0) goto LAB_001bf38e;
        if ((char)pBuf[1] < '\0') {
          uVar3 = sqlite3Fts3GetVarint32((char *)(pBuf + 1),&local_7c);
          uVar5 = (ulong)uVar3;
        }
        else {
          uVar5 = 1;
          local_7c = (int)(char)pBuf[1];
        }
        pBuf = pBuf + 1 + uVar5;
        iVar4 = local_7c;
      }
      else {
        bVar8 = *pbVar10;
        if (1 < bVar8) {
          do {
            bVar9 = bVar8 & 0x80;
            bVar8 = pbVar10[1];
            pbVar10 = pbVar10 + 1;
          } while ((bVar8 & 0xfe) != 0 || bVar9 != 0);
        }
        if (bVar8 == 0) goto LAB_001bf38e;
        if ((char)pbVar10[1] < '\0') {
          uVar3 = sqlite3Fts3GetVarint32((char *)(pbVar10 + 1),&local_80);
          uVar5 = (ulong)uVar3;
        }
        else {
          uVar5 = 1;
          local_80 = (int)(char)pbVar10[1];
        }
        pbVar10 = pbVar10 + 1 + uVar5;
      }
    }
    if (iVar4 != 0) {
      *pbVar16 = 1;
      uVar5 = (long)local_7c;
      pbVar15 = pbVar16 + 1;
      do {
        pbVar14 = pbVar15;
        bVar8 = (byte)uVar5;
        *pbVar14 = bVar8 | 0x80;
        pbVar15 = pbVar14 + 1;
        bVar1 = 0x7f < uVar5;
        uVar5 = uVar5 >> 7;
      } while (bVar1);
      *pbVar14 = bVar8;
    }
    local_70 = pp2;
    local_58 = pbVar16;
    iVar4 = sqlite3Fts3GetVarint((char *)pBuf,&local_78);
    lVar13 = local_78;
    pBuf = pBuf + iVar4;
    iVar4 = sqlite3Fts3GetVarint((char *)pbVar10,&local_78);
    pbVar10 = pbVar10 + iVar4;
    pp2 = local_70;
    if ((lVar13 < 2) || (local_78 < 2)) {
LAB_001bf38e:
      bVar8 = *pbVar10;
      if (bVar8 != 0) {
        do {
          pbVar16 = pbVar10 + 1;
          pbVar10 = pbVar10 + 1;
          bVar9 = bVar8 & 0x80;
          bVar8 = *pbVar16;
        } while (bVar9 != 0 || *pbVar16 != 0);
      }
      bVar8 = *pBuf;
      pbVar10 = pbVar10 + 1;
      if (bVar8 == 0) goto LAB_001bf3cf;
      goto LAB_001bf3be;
    }
    lVar11 = local_78 + -2;
    lVar6 = 0;
    pbVar16 = pbVar15;
    while( true ) {
      local_48 = lVar13 + -2;
      lVar13 = local_48 + local_38;
      while( true ) {
        pp2 = local_70;
        if ((lVar11 == lVar13) || (((lVar11 <= lVar13 && (local_4c == 0)) && (local_48 < lVar11))))
        {
          lVar12 = local_48;
          if (local_5c == 0) {
            lVar12 = lVar11;
          }
          uVar5 = (lVar12 - lVar6) + 2;
          do {
            pbVar15 = pbVar16;
            bVar8 = (byte)uVar5;
            *pbVar15 = bVar8 | 0x80;
            pbVar16 = pbVar15 + 1;
            bVar1 = 0x7f < uVar5;
            uVar5 = uVar5 >> 7;
          } while (bVar1);
          *pbVar15 = bVar8;
          local_58 = (byte *)0x0;
          lVar6 = lVar12;
        }
        pbVar15 = local_58;
        if ((local_48 < lVar11) && (local_5c != 0 || lVar13 < lVar11)) break;
        if (*pbVar10 < 2) {
          bVar8 = *pBuf;
          if (local_58 == (byte *)0x0) {
            pbVar15 = pbVar16;
          }
          if (1 < bVar8) {
            do {
              bVar9 = bVar8 & 0x80;
              bVar8 = pBuf[1];
              pBuf = pBuf + 1;
            } while ((bVar8 & 0xfe) != 0 || bVar9 != 0);
          }
          goto LAB_001bf2dc;
        }
        iVar4 = sqlite3Fts3GetVarint((char *)pbVar10,&local_78);
        pbVar10 = pbVar10 + iVar4;
        lVar11 = lVar11 + local_78 + -2;
      }
      bVar8 = *pBuf;
      if (bVar8 < 2) break;
      iVar4 = sqlite3Fts3GetVarint((char *)pBuf,&local_78);
      pBuf = pBuf + iVar4;
      lVar13 = local_48 + local_78;
    }
    if (local_58 == (byte *)0x0) {
      pbVar15 = pbVar16;
    }
LAB_001bf2dc:
    bVar9 = *pbVar10;
    if (1 < bVar9) {
      do {
        bVar2 = bVar9 & 0x80;
        bVar9 = pbVar10[1];
        pbVar10 = pbVar10 + 1;
      } while ((bVar9 & 0xfe) != 0 || bVar2 != 0);
    }
    if (bVar8 == 0) goto LAB_001bf38e;
    if (bVar9 == 0) {
      pbVar10 = pbVar10 + 1;
LAB_001bf3be:
      do {
        pbVar16 = pBuf + 1;
        pBuf = pBuf + 1;
        bVar9 = bVar8 & 0x80;
        bVar8 = *pbVar16;
      } while (bVar9 != 0 || *pbVar16 != 0);
LAB_001bf3cf:
      *local_40 = (char *)(pBuf + 1);
      *pp2 = (char *)pbVar10;
      pbVar16 = (byte *)*local_68;
      if (pbVar16 != pbVar15) {
        *pbVar15 = 0;
        *local_68 = (char *)(pbVar15 + 1);
      }
      return (uint)(pbVar16 != pbVar15);
    }
    if ((char)pBuf[1] < '\0') {
      uVar3 = sqlite3Fts3GetVarint32((char *)(pBuf + 1),&local_7c);
      uVar5 = (ulong)uVar3;
    }
    else {
      uVar5 = 1;
      local_7c = (int)(char)pBuf[1];
    }
    if ((char)pbVar10[1] < '\0') {
      uVar3 = sqlite3Fts3GetVarint32((char *)(pbVar10 + 1),&local_80);
      uVar7 = (ulong)uVar3;
    }
    else {
      uVar7 = 1;
      local_80 = (int)(char)pbVar10[1];
    }
    pBuf = pBuf + 1 + uVar5;
    pbVar10 = pbVar10 + 1 + uVar7;
    pbVar16 = pbVar15;
  } while( true );
}

Assistant:

static int fts3PoslistPhraseMerge(
  char **pp,                      /* IN/OUT: Preallocated output buffer */
  int nToken,                     /* Maximum difference in token positions */
  int isSaveLeft,                 /* Save the left position */
  int isExact,                    /* If *pp1 is exactly nTokens before *pp2 */
  char **pp1,                     /* IN/OUT: Left input list */
  char **pp2                      /* IN/OUT: Right input list */
){
  char *p = *pp;
  char *p1 = *pp1;
  char *p2 = *pp2;
  int iCol1 = 0;
  int iCol2 = 0;

  /* Never set both isSaveLeft and isExact for the same invocation. */
  assert( isSaveLeft==0 || isExact==0 );

  assert( p!=0 && *p1!=0 && *p2!=0 );
  if( *p1==POS_COLUMN ){ 
    p1++;
    p1 += fts3GetVarint32(p1, &iCol1);
  }
  if( *p2==POS_COLUMN ){ 
    p2++;
    p2 += fts3GetVarint32(p2, &iCol2);
  }

  while( 1 ){
    if( iCol1==iCol2 ){
      char *pSave = p;
      sqlite3_int64 iPrev = 0;
      sqlite3_int64 iPos1 = 0;
      sqlite3_int64 iPos2 = 0;

      if( iCol1 ){
        *p++ = POS_COLUMN;
        p += sqlite3Fts3PutVarint(p, iCol1);
      }

      fts3GetDeltaVarint(&p1, &iPos1); iPos1 -= 2;
      fts3GetDeltaVarint(&p2, &iPos2); iPos2 -= 2;
      if( iPos1<0 || iPos2<0 ) break;

      while( 1 ){
        if( iPos2==iPos1+nToken 
         || (isExact==0 && iPos2>iPos1 && iPos2<=iPos1+nToken) 
        ){
          sqlite3_int64 iSave;
          iSave = isSaveLeft ? iPos1 : iPos2;
          fts3PutDeltaVarint(&p, &iPrev, iSave+2); iPrev -= 2;
          pSave = 0;
          assert( p );
        }
        if( (!isSaveLeft && iPos2<=(iPos1+nToken)) || iPos2<=iPos1 ){
          if( (*p2&0xFE)==0 ) break;
          fts3GetDeltaVarint(&p2, &iPos2); iPos2 -= 2;
        }else{
          if( (*p1&0xFE)==0 ) break;
          fts3GetDeltaVarint(&p1, &iPos1); iPos1 -= 2;
        }
      }

      if( pSave ){
        assert( pp && p );
        p = pSave;
      }

      fts3ColumnlistCopy(0, &p1);
      fts3ColumnlistCopy(0, &p2);
      assert( (*p1&0xFE)==0 && (*p2&0xFE)==0 );
      if( 0==*p1 || 0==*p2 ) break;

      p1++;
      p1 += fts3GetVarint32(p1, &iCol1);
      p2++;
      p2 += fts3GetVarint32(p2, &iCol2);
    }

    /* Advance pointer p1 or p2 (whichever corresponds to the smaller of
    ** iCol1 and iCol2) so that it points to either the 0x00 that marks the
    ** end of the position list, or the 0x01 that precedes the next 
    ** column-number in the position list. 
    */
    else if( iCol1<iCol2 ){
      fts3ColumnlistCopy(0, &p1);
      if( 0==*p1 ) break;
      p1++;
      p1 += fts3GetVarint32(p1, &iCol1);
    }else{
      fts3ColumnlistCopy(0, &p2);
      if( 0==*p2 ) break;
      p2++;
      p2 += fts3GetVarint32(p2, &iCol2);
    }
  }

  fts3PoslistCopy(0, &p2);
  fts3PoslistCopy(0, &p1);
  *pp1 = p1;
  *pp2 = p2;
  if( *pp==p ){
    return 0;
  }
  *p++ = 0x00;
  *pp = p;
  return 1;
}